

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O2

void libtorrent::anon_unknown_40::add_files_impl
               (vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                *files,string *p,string *l,
               function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *pred,create_flags_t flags)

{
  bool bVar1;
  char *in_R9;
  string_view rhs;
  string_view rhs_00;
  string_view lhs;
  string_view lhs_00;
  file_flags_t file_flags;
  error_code ec;
  string sym_path;
  string f;
  string leaf;
  file_status s;
  bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void> local_135;
  create_flags_t local_134;
  vector<libtorrent::create_file_entry,std::allocator<libtorrent::create_file_entry>> *local_130;
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *local_128;
  error_code local_120;
  int local_10c;
  directory local_108;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  file_status local_78;
  string local_50;
  
  rhs._M_str = in_R9;
  rhs._M_len = (size_t)(l->_M_dataplus)._M_p;
  lhs._M_str = (char *)l->_M_string_length;
  lhs._M_len = (size_t)(p->_M_dataplus)._M_p;
  local_134.m_val = flags.m_val;
  local_130 = (vector<libtorrent::create_file_entry,std::allocator<libtorrent::create_file_entry>> *
              )files;
  combine_path_abi_cxx11_(&local_d8,(libtorrent *)p->_M_string_length,lhs,rhs);
  ::std::__cxx11::string::string((string *)&local_98,(string *)&local_d8);
  bVar1 = ::std::
          function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          ::operator()(pred,&local_98);
  ::std::__cxx11::string::~string((string *)&local_98);
  if (!bVar1) goto LAB_0019254d;
  local_120.val_ = 0;
  local_120.failed_ = false;
  local_120.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  local_78.mtime = 0;
  local_78.ctime = 0;
  local_78.mode.m_val = 0;
  local_78.file_size = 0;
  local_78.atime = 0;
  stat_file(&local_d8,&local_78,&local_120,(file_status_flag_t)((local_134.m_val & 8) >> 3));
  if (local_120.failed_ != false) goto LAB_0019254d;
  if ((local_78.mode.m_val & 8) == 0) {
    if ((local_78.mode.m_val & 1) != 0) {
LAB_0019244f:
      local_128 = pred;
      aux::directory::directory(&local_108,&local_d8,&local_120);
      while (local_108.m_done != true) {
        aux::directory::file_abi_cxx11_(&local_b8,&local_108);
        bVar1 = ignore_subdir(&local_b8);
        if (!bVar1) {
          rhs_00._M_str = in_R9;
          rhs_00._M_len = (size_t)local_b8._M_dataplus._M_p;
          lhs_00._M_str = (char *)local_b8._M_string_length;
          lhs_00._M_len = (size_t)(l->_M_dataplus)._M_p;
          combine_path_abi_cxx11_(&local_50,(libtorrent *)l->_M_string_length,lhs_00,rhs_00);
          add_files_impl((vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                          *)local_130,p,&local_50,local_128,local_134);
          ::std::__cxx11::string::~string((string *)&local_50);
        }
        ::std::__cxx11::string::~string((string *)&local_b8);
        aux::directory::next(&local_108,&local_120);
      }
      aux::directory::~directory(&local_108);
      goto LAB_0019254d;
    }
  }
  else if (((local_134.m_val & 8) == 0 & (byte)local_78.mode.m_val) != 0) goto LAB_0019244f;
  local_135.m_val = (byte)(local_78.mode.m_val & 8) | (byte)local_78.mode.m_val & 6;
  if ((local_134.m_val >> 8 & 1) != 0) {
    local_135.m_val = 0;
  }
  if (local_135.m_val < 8 || (local_134.m_val & 8) == 0) {
    local_108.m_handle = (DIR *)local_78.mtime;
    ::std::vector<libtorrent::create_file_entry,std::allocator<libtorrent::create_file_entry>>::
    emplace_back<std::__cxx11::string,long&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::file_flags_tag,void>const&,long>
              (local_130,l,&local_78.file_size,&local_135,(long *)&local_108);
  }
  else {
    aux::get_symlink_path((string *)&local_108,&local_d8);
    local_10c = 0;
    local_b8._M_dataplus._M_p = (pointer)local_78.mtime;
    ::std::vector<libtorrent::create_file_entry,std::allocator<libtorrent::create_file_entry>>::
    emplace_back<std::__cxx11::string,int,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::file_flags_tag,void>const&,long,std::__cxx11::string>
              (local_130,l,&local_10c,&local_135,(long *)&local_b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108);
    ::std::__cxx11::string::~string((string *)&local_108);
  }
LAB_0019254d:
  ::std::__cxx11::string::~string((string *)&local_d8);
  return;
}

Assistant:

void add_files_impl(std::vector<create_file_entry>& files
		, std::string const& p
		, std::string l
		, std::function<bool(std::string)> const& pred
		, create_flags_t const flags)
	{
		std::string f = combine_path(p, l);
		if (!pred(f)) return;
		error_code ec;
		file_status s;
		stat_file(f, &s, ec, (flags & create_torrent::symlinks) ? dont_follow_links : file_status_flag_t{});
		if (ec) return;

		// recurse into directories
		bool recurse = bool(s.mode & file_status::directory);

		// if the file is not a link or we're following links, and it's a directory
		// only then should we recurse
		if ((s.mode & file_status::symlink) && (flags & create_torrent::symlinks))
			recurse = false;

		if (recurse)
		{
			for (aux::directory i(std::move(f), ec); !i.done(); i.next(ec))
			{
				std::string leaf = i.file();
				if (ignore_subdir(leaf)) continue;
				add_files_impl(files, p, combine_path(std::move(l), std::move(leaf)), pred, flags);
			}
		}
		else
		{
			file_flags_t const file_flags = (flags & create_torrent::no_attributes)
				? file_flags_t{}
				: ((s.mode & file_status::hidden) ? file_storage::flag_hidden : file_flags_t{})
					| ((s.mode & file_status::executable) ? file_storage::flag_executable : file_flags_t{})
					| ((s.mode & file_status::symlink) ? file_storage::flag_symlink : file_flags_t{})
					;

			// mask all bits to check if the file is a symlink
			if ((file_flags & file_storage::flag_symlink)
				&& (flags & create_torrent::symlinks))
			{
				std::string sym_path = aux::get_symlink_path(f);
				files.emplace_back(std::move(l), 0, file_flags, std::time_t(s.mtime)
					, std::move(sym_path));
			}
			else
			{
				files.emplace_back(std::move(l), s.file_size, file_flags, std::time_t(s.mtime));
			}
		}
	}